

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectivec_helpers.cc
# Opt level: O0

void google::protobuf::compiler::objectivec::anon_unknown_0::PathSplit
               (string *path,string *directory,string *basename)

{
  string local_68 [32];
  string local_48 [32];
  long local_28;
  size_type last_slash;
  string *basename_local;
  string *directory_local;
  string *path_local;
  
  last_slash = (size_type)basename;
  basename_local = directory;
  directory_local = path;
  local_28 = std::__cxx11::string::rfind((char)path,0x2f);
  if (local_28 == -1) {
    if (basename_local != (string *)0x0) {
      std::__cxx11::string::operator=((string *)basename_local,"");
    }
    if (last_slash != 0) {
      std::__cxx11::string::operator=((string *)last_slash,(string *)directory_local);
    }
  }
  else {
    if (basename_local != (string *)0x0) {
      std::__cxx11::string::substr((ulong)local_48,(ulong)directory_local);
      std::__cxx11::string::operator=((string *)basename_local,local_48);
      std::__cxx11::string::~string(local_48);
    }
    if (last_slash != 0) {
      std::__cxx11::string::substr((ulong)local_68,(ulong)directory_local);
      std::__cxx11::string::operator=((string *)last_slash,local_68);
      std::__cxx11::string::~string(local_68);
    }
  }
  return;
}

Assistant:

void PathSplit(const std::string& path, std::string* directory,
               std::string* basename) {
  std::string::size_type last_slash = path.rfind('/');
  if (last_slash == std::string::npos) {
    if (directory) {
      *directory = "";
    }
    if (basename) {
      *basename = path;
    }
  } else {
    if (directory) {
      *directory = path.substr(0, last_slash);
    }
    if (basename) {
      *basename = path.substr(last_slash + 1);
    }
  }
}